

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64builder.cpp
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::a64::Builder::finalize(Builder *this)

{
  Error EVar1;
  Assembler a;
  Assembler AStack_c8;
  
  EVar1 = BaseBuilder::runPasses(&this->super_BaseBuilder);
  if (EVar1 == 0) {
    Assembler::Assembler(&AStack_c8,(this->super_BaseBuilder).super_BaseEmitter._code);
    AStack_c8.super_BaseAssembler.super_BaseEmitter._encodingOptions =
         AStack_c8.super_BaseAssembler.super_BaseEmitter._encodingOptions |
         (this->super_BaseBuilder).super_BaseEmitter._encodingOptions;
    BaseEmitter::addDiagnosticOptions
              ((BaseEmitter *)&AStack_c8,
               (this->super_BaseBuilder).super_BaseEmitter._diagnosticOptions);
    EVar1 = BaseBuilder::serializeTo(&this->super_BaseBuilder,(BaseEmitter *)&AStack_c8);
    Assembler::~Assembler(&AStack_c8);
  }
  return EVar1;
}

Assistant:

Error Builder::finalize() {
  ASMJIT_PROPAGATE(runPasses());
  Assembler a(_code);
  a.addEncodingOptions(encodingOptions());
  a.addDiagnosticOptions(diagnosticOptions());
  return serializeTo(&a);
}